

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O0

void aom_yv12_partial_copy_u_c
               (YV12_BUFFER_CONFIG *src_bc,int hstart1,int hend1,int vstart1,int vend1,
               YV12_BUFFER_CONFIG *dst_bc,int hstart2,int vstart2)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  uint16_t *dst16;
  uint16_t *src16;
  uint8_t *dst;
  uint8_t *src;
  int row;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_24;
  
  local_24 = in_ECX;
  if ((*(uint *)(in_RDI + 0xc0) & 8) == 0) {
    local_30 = (void *)(*(long *)(in_RDI + 0x30) + (long)(in_ECX * *(int *)(in_RDI + 0x24)) +
                       (long)in_ESI);
    local_38 = (void *)(*(long *)(in_R9 + 0x30) + (long)((int)dst * *(int *)(in_R9 + 0x24)) +
                       (long)(int)src16);
    for (; local_24 < in_R8D; local_24 = local_24 + 1) {
      memcpy(local_38,local_30,(long)(in_EDX - in_ESI));
      local_30 = (void *)((long)local_30 + (long)*(int *)(in_RDI + 0x24));
      local_38 = (void *)((long)local_38 + (long)*(int *)(in_R9 + 0x24));
    }
  }
  else {
    local_40 = (void *)((*(long *)(in_RDI + 0x30) + (long)(in_ECX * *(int *)(in_RDI + 0x24)) +
                        (long)in_ESI) * 2);
    local_48 = (void *)((*(long *)(in_R9 + 0x30) + (long)((int)dst * *(int *)(in_R9 + 0x24)) +
                        (long)(int)src16) * 2);
    for (; local_24 < in_R8D; local_24 = local_24 + 1) {
      memcpy(local_48,local_40,(long)(in_EDX - in_ESI) << 1);
      local_40 = (void *)((long)local_40 + (long)*(int *)(in_RDI + 0x24) * 2);
      local_48 = (void *)((long)local_48 + (long)*(int *)(in_R9 + 0x24) * 2);
    }
  }
  return;
}

Assistant:

void aom_yv12_partial_copy_u_c(const YV12_BUFFER_CONFIG *src_bc, int hstart1,
                               int hend1, int vstart1, int vend1,
                               YV12_BUFFER_CONFIG *dst_bc, int hstart2,
                               int vstart2) {
  int row;
  const uint8_t *src = src_bc->u_buffer;
  uint8_t *dst = dst_bc->u_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 =
        CONVERT_TO_SHORTPTR(src + vstart1 * src_bc->uv_stride + hstart1);
    uint16_t *dst16 =
        CONVERT_TO_SHORTPTR(dst + vstart2 * dst_bc->uv_stride + hstart2);
    for (row = vstart1; row < vend1; ++row) {
      memcpy(dst16, src16, (hend1 - hstart1) * sizeof(uint16_t));
      src16 += src_bc->uv_stride;
      dst16 += dst_bc->uv_stride;
    }
    return;
  }
#endif
  src = (src + vstart1 * src_bc->uv_stride + hstart1);
  dst = (dst + vstart2 * dst_bc->uv_stride + hstart2);

  for (row = vstart1; row < vend1; ++row) {
    memcpy(dst, src, (hend1 - hstart1));
    src += src_bc->uv_stride;
    dst += dst_bc->uv_stride;
  }
}